

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPGEX_TransformedView.h
# Opt level: O3

vi2d __thiscall olc::TransformedView::ScaleToScreen(TransformedView *this,vf2d *vWorldSize)

{
  undefined8 uVar1;
  vf2d vVar2;
  undefined8 *in_RDX;
  float fVar3;
  float fVar4;
  
  uVar1 = *in_RDX;
  vVar2 = vWorldSize[2];
  fVar3 = floorf(vVar2.x * (float)uVar1);
  fVar4 = floorf(vVar2.y * (float)((ulong)uVar1 >> 0x20));
  (this->super_PGEX)._vptr_PGEX = (_func_int **)CONCAT44((int)fVar4,(int)fVar3);
  return (vi2d)this;
}

Assistant:

olc::vi2d TransformedView::ScaleToScreen(const olc::vf2d& vWorldSize) const
	{
		olc::vf2d vFloat = vWorldSize * m_vWorldScale;		
		return vFloat.floor();
	}